

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void __thiscall
fmt::v5::internal::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,emphasis em)

{
  byte in_SIL;
  long lVar1;
  long in_RDI;
  int i;
  size_t index;
  uint8_t em_bits;
  uint8_t em_codes [4];
  int local_1c;
  long local_18;
  char local_d [13];
  
  local_d[4] = in_SIL;
  memset(local_d,0,4);
  if ((local_d[4] & 1U) != 0) {
    local_d[0] = '\x01';
  }
  if ((local_d[4] & 2U) != 0) {
    local_d[1] = 3;
  }
  if ((local_d[4] & 4U) != 0) {
    local_d[2] = 4;
  }
  if ((local_d[4] & 8U) != 0) {
    local_d[3] = 9;
  }
  local_18 = 0;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    if (local_d[local_1c] != '\0') {
      *(undefined1 *)(in_RDI + local_18) = 0x1b;
      *(undefined1 *)(in_RDI + local_18 + 1) = 0x5b;
      lVar1 = local_18 + 3;
      *(char *)(in_RDI + local_18 + 2) = local_d[local_1c] + '0';
      local_18 = local_18 + 4;
      *(undefined1 *)(in_RDI + lVar1) = 0x6d;
    }
  }
  *(undefined1 *)(in_RDI + local_18) = 0;
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(emphasis em) FMT_NOEXCEPT {
    uint8_t em_codes[4] = {};
    uint8_t em_bits = static_cast<uint8_t>(em);
    if (em_bits & static_cast<uint8_t>(emphasis::bold))
      em_codes[0] = 1;
    if (em_bits & static_cast<uint8_t>(emphasis::italic))
      em_codes[1] = 3;
    if (em_bits & static_cast<uint8_t>(emphasis::underline))
      em_codes[2] = 4;
    if (em_bits & static_cast<uint8_t>(emphasis::strikethrough))
      em_codes[3] = 9;

    std::size_t index = 0;
    for (int i = 0; i < 4; ++i) {
      if (!em_codes[i])
        continue;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');
      buffer[index++] = static_cast<Char>('0' + em_codes[i]);
      buffer[index++] = static_cast<Char>('m');
    }
    buffer[index++] = static_cast<Char>(0);
  }